

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O1

void __thiscall
cmComputeComponentGraph::cmComputeComponentGraph(cmComputeComponentGraph *this,Graph *input)

{
  Graph *this_00;
  
  this->InputGraph = input;
  this_00 = &this->ComponentGraph;
  memset(this_00,0,200);
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->TarjanStack,0);
  Tarjan(this);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->Components).
                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->Components).
                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  TransferEdges(this);
  return;
}

Assistant:

cmComputeComponentGraph::cmComputeComponentGraph(Graph const& input):
  InputGraph(input)
{
  // Identify components.
  this->Tarjan();

  // Compute the component graph.
  this->ComponentGraph.resize(0);
  this->ComponentGraph.resize(this->Components.size());
  this->TransferEdges();
}